

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall google::protobuf::RepeatedField<long>::RemoveLast(RepeatedField<long> *this)

{
  ulong uVar1;
  int v1;
  string *psVar2;
  bool is_soo;
  LogMessageFatal local_30 [16];
  
  uVar1 = (this->soo_rep_).field_0.long_rep.elements_int;
  v1 = internal::SooRep::size(&this->soo_rep_,(uVar1 & 4) == 0);
  psVar2 = absl::lts_20240722::log_internal::Check_GTImpl_abi_cxx11_(v1,0,"old_size > 0");
  if (psVar2 == (string *)0x0) {
    is_soo = (uVar1 & 4) == 0;
    elements(this,is_soo);
    ExchangeCurrentSize(this,is_soo,v1 + -1);
    return;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/repeated_field.h"
             ,0x3bb,psVar2->_M_string_length,(psVar2->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_30);
}

Assistant:

inline void RepeatedField<Element>::RemoveLast() {
  const bool is_soo = this->is_soo();
  const int old_size = size(is_soo);
  ABSL_DCHECK_GT(old_size, 0);
  elements(is_soo)[old_size - 1].~Element();
  ExchangeCurrentSize(is_soo, old_size - 1);
}